

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convert.cc
# Opt level: O1

int BN_print(void *fp,BIGNUM *a)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  ulong uVar6;
  ulong uVar7;
  long lVar8;
  bool bVar9;
  bool bVar10;
  
  if (((a->neg == 0) || (iVar3 = BIO_write((BIO *)fp,"-",1), iVar3 == 1)) &&
     ((iVar3 = BN_is_zero((BIGNUM *)a), iVar3 == 0 ||
      (iVar3 = BIO_write((BIO *)fp,"0",1), iVar3 == 1)))) {
    uVar4 = bn_minimal_width((BIGNUM *)a);
    bVar1 = false;
    uVar7 = (ulong)uVar4;
    do {
      iVar3 = (int)uVar7;
      if (iVar3 < 1) break;
      lVar8 = 0x3c;
      bVar10 = false;
      do {
        uVar6 = (ulong)((uint)(a->d[uVar7 - 1] >> ((byte)lVar8 & 0x3f)) & 0xf);
        if (bVar1) {
LAB_00176c47:
          iVar5 = BIO_write((BIO *)fp,"0123456789abcdef" + uVar6,1);
          bVar9 = iVar5 == 1;
          bVar2 = bVar1;
          if (bVar9) {
            bVar2 = true;
          }
        }
        else {
          bVar9 = true;
          bVar2 = false;
          if (uVar6 != 0) goto LAB_00176c47;
        }
        bVar1 = bVar2;
        if (!bVar9) break;
        lVar8 = lVar8 + -4;
        bVar10 = lVar8 == -4;
      } while (!bVar10);
      uVar7 = uVar7 - 1;
    } while (bVar10);
    uVar4 = (uint)(iVar3 < 1);
  }
  else {
    uVar4 = 0;
  }
  return uVar4;
}

Assistant:

int BN_print(BIO *bp, const BIGNUM *a) {
  if (a->neg && BIO_write(bp, "-", 1) != 1) {
    return 0;
  }

  if (BN_is_zero(a) && BIO_write(bp, "0", 1) != 1) {
    return 0;
  }

  int z = 0;
  for (int i = bn_minimal_width(a) - 1; i >= 0; i--) {
    for (int j = BN_BITS2 - 4; j >= 0; j -= 4) {
      // strip leading zeros
      int v = ((int)(a->d[i] >> (long)j)) & 0x0f;
      if (z || v != 0) {
        if (BIO_write(bp, &hextable[v], 1) != 1) {
          return 0;
        }
        z = 1;
      }
    }
  }
  return 1;
}